

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_spawn(Executor *this,size_t N)

{
  pointer pWVar1;
  long lVar2;
  size_t id;
  size_t sVar3;
  long lVar4;
  anon_class_16_2_d7082b3e_for__M_head_impl local_48;
  thread local_38;
  
  lVar4 = 0x28;
  lVar2 = 0;
  for (sVar3 = 0; N != sVar3; sVar3 = sVar3 + 1) {
    pWVar1 = (this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.w = (value_type *)((long)pWVar1 + lVar4 + -0x28);
    *(size_t *)((long)pWVar1 + lVar4 + -0x20) = sVar3;
    *(size_t *)((long)pWVar1 + lVar4 + -0x18) = sVar3;
    *(Executor **)((long)pWVar1 + lVar4 + -0x10) = this;
    *(long *)((long)pWVar1 + lVar4 + -8) =
         (long)&(((this->_notifier)._waiters.
                  super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
                  ._M_impl.super__Vector_impl_data._M_start)->next).
                super___atomic_base<unsigned_long>._M_i + lVar2;
    local_48.this = this;
    std::thread::thread<tf::Executor::_spawn(unsigned_long)::_lambda()_1_,,void>
              (&local_38,&local_48);
    std::thread::operator=
              ((thread *)
               (&((this->_workers).super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>.
                  _M_impl.super__Vector_impl_data._M_start)->_done + lVar4),&local_38);
    std::thread::~thread(&local_38);
    lVar4 = lVar4 + 0x980;
    lVar2 = lVar2 + 0x80;
  }
  return;
}

Assistant:

inline void Executor::_spawn(size_t N) {

  for(size_t id=0; id<N; ++id) {

    _workers[id]._id = id;
    _workers[id]._vtm = id;
    _workers[id]._executor = this;
    _workers[id]._waiter = &_notifier._waiters[id];
    _workers[id]._thread = std::thread([&, &w=_workers[id]] () {

      pt::this_worker = &w;

      // initialize the random engine and seed for work-stealing loop
      w._rdgen.seed(static_cast<std::default_random_engine::result_type>(
        std::hash<std::thread::id>()(std::this_thread::get_id()))
      );

      // before entering the work-stealing loop, call the scheduler prologue
      if(_worker_interface) {
        _worker_interface->scheduler_prologue(w);
      }

      Node* t = nullptr;
      std::exception_ptr ptr = nullptr;

      // must use 1 as condition instead of !done because
      // the previous worker may stop while the following workers
      // are still preparing for entering the scheduling loop
      try {

        // worker loop
        while(1) {

          // drain out the local queue
          _exploit_task(w, t);

          // steal and wait for tasks
          if(_wait_for_task(w, t) == false) {
            break;
          }
        }
      } 
      catch(...) {
        ptr = std::current_exception();
      }
      
      // call the user-specified epilogue function
      if(_worker_interface) {
        _worker_interface->scheduler_epilogue(w, ptr);
      }

    });
  } 
}